

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::IoTest_FileWriteError_Test::IoTest_FileWriteError_Test
          (IoTest_FileWriteError_Test *this)

{
  IoTest_FileWriteError_Test *this_local;
  
  IoTest::IoTest(&this->super_IoTest);
  (this->super_IoTest).super_Test._vptr_Test =
       (_func_int **)&PTR__IoTest_FileWriteError_Test_02a1f938;
  return;
}

Assistant:

TEST_F(IoTest, FileWriteError) {
  MsvcDebugDisabler debug_disabler;

  // -1 = invalid file descriptor.
  FileOutputStream input(-1);

  void* buffer;
  int size;

  // The first call to Next() succeeds because it doesn't have anything to
  // write yet.
  EXPECT_TRUE(input.Next(&buffer, &size));

  // Second call fails.
  EXPECT_FALSE(input.Next(&buffer, &size));

  EXPECT_EQ(EBADF, input.GetErrno());
}